

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

int __thiscall mpt::array::set(array *this,value *val)

{
  content *pcVar1;
  iovec *piVar2;
  char *pcVar3;
  type_traits *traits;
  buffer *pbVar4;
  long lVar5;
  int iVar6;
  uint type;
  int type_00;
  size_t len;
  size_t local_40;
  char *local_38;
  
  local_38 = (char *)val->_addr;
  type_00 = (int)val->_type;
  if (type_00 == 0x40) {
    traits = (type_traits *)0x0;
LAB_0012d55d:
    len = 0;
    piVar2 = value::vector(val,0);
    if (piVar2 == (iovec *)0x0) {
      local_38 = (char *)0x0;
      local_40 = len;
    }
    else {
      local_38 = (char *)piVar2->iov_base;
      len = piVar2->iov_len;
      local_40 = len;
    }
  }
  else {
    if (type_00 == 0x73) {
      local_38 = value::string(val);
      local_40 = 0;
      if (local_38 == (char *)0x0) {
        len = 0;
      }
      else {
        local_40 = strlen(local_38);
        len = local_40 + 1;
      }
    }
    else {
      type = type_00 + 0x20U & 0xff;
      if (0x19 < type_00 - 0x40U) {
        type = 0;
      }
      traits = type_traits::get(type);
      if (traits != (type_traits *)0x0) goto LAB_0012d55d;
      pcVar3 = (char *)mpt_data_tostring(&local_38,(long)type_00,&local_40);
      if (pcVar3 == (char *)0x0) {
        traits = type_traits::get(type_00);
        if (traits == (type_traits *)0x0) {
          return -3;
        }
        if (local_38 == (char *)0x0) {
          len = 0;
          local_40 = len;
        }
        else {
          len = traits->size;
          local_40 = len;
        }
        goto LAB_0012d5f2;
      }
      local_38 = pcVar3;
      if (local_40 == 0) {
        len = 0;
      }
      else {
        len = (local_40 + 1) - (ulong)(pcVar3[local_40 - 1] == '\0');
      }
    }
    traits = type_traits::get(99);
  }
LAB_0012d5f2:
  pbVar4 = buffer::create(len,traits);
  iVar6 = -4;
  if (pbVar4 != (buffer *)0x0) {
    lVar5 = mpt_buffer_set(pbVar4,traits,local_40,local_38,0);
    if ((lVar5 == 0) ||
       ((local_40 < len && (lVar5 = mpt_buffer_set(pbVar4,traits,1,""), lVar5 == 0)))) {
      (*pbVar4->_vptr_buffer[1])(pbVar4);
    }
    else {
      pcVar1 = (this->_buf)._ref;
      if (pcVar1 != (content *)0x0) {
        (**(code **)(*(long *)pcVar1 + 8))();
      }
      (this->_buf)._ref = (content *)pbVar4;
      iVar6 = type_00;
    }
  }
  return iVar6;
}

Assistant:

int array::set(const value &val)
{
	const type_traits *traits = 0;
	size_t len, reserve;
	const int type = val.type();
	const void *ptr = val.data();
	const char *base = 0;
	
	// string data directly
	if (type == 's') {
		ptr = base = val.string();
		len = reserve = 0;
		if (base) {
			len = strlen(base);
			reserve = len + 1;
		}
		traits = type_traits::get('c');
	}
	// get vector data
	else if (type == TypeVector || (traits = type_traits::get(MPT_type_toScalar(type)))) {
		const struct iovec *vec = val.vector(0);
		if (vec) {
			ptr = vec->iov_base;
			len = vec->iov_len;
		} else {
			ptr = 0;
			len = 0;
		}
		reserve = len;
	}
	// try string extraction
	else if ((base = mpt_data_tostring(&ptr, type, &len))) {
		reserve = len && base[len - 1] ? len + 1 : len;
		ptr = base;
		traits = type_traits::get('c');
	}
	// put scalar entity as single array element
	else if ((traits = type_traits::get(type))) {
		len = ptr ? traits->size : 0;
		reserve = len;
	}
	else {
		return BadType;
	}
	// reserve typed buffer content
	buffer *buf = buffer::create(reserve, traits);
	if (!buf) {
		return BadOperation;
	}
	if (!mpt_buffer_set(buf, traits, len, ptr, 0)
	 || ((reserve > len) && !mpt_buffer_set(buf, traits, 1, "", len))) {
		buf->unref();
		return BadOperation;
	}
	_buf.set_instance(static_cast<content *>(buf));
	return type;
}